

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

bool __thiscall units::detail::unit_data::equivalent_non_counting(unit_data *this,unit_data *other)

{
  undefined1 local_11;
  unit_data *other_local;
  unit_data *this_local;
  
  local_11 = false;
  if ((((((int)*this << 0x1c) >> 0x1c == ((int)*other << 0x1c) >> 0x1c) &&
       (local_11 = false, ((int)*this << 0x18) >> 0x1c == ((int)*other << 0x18) >> 0x1c)) &&
      (local_11 = false, ((int)*this << 0x15) >> 0x1d == ((int)*other << 0x15) >> 0x1d)) &&
     (((local_11 = false, ((int)*this << 0x12) >> 0x1d == ((int)*other << 0x12) >> 0x1d &&
       (local_11 = false, ((int)*this << 0x10) >> 0x1e == ((int)*other << 0x10) >> 0x1e)) &&
      (local_11 = false, ((int)*this << 0xd) >> 0x1d == ((int)*other << 0xd) >> 0x1d)))) {
    local_11 = ((int)*this << 6) >> 0x1e == ((int)*other << 6) >> 0x1e;
  }
  return local_11;
}

Assistant:

constexpr bool equivalent_non_counting(const unit_data& other) const
        {
            return meter_ == other.meter_ && second_ == other.second_ &&
                kilogram_ == other.kilogram_ && ampere_ == other.ampere_ &&
                candela_ == other.candela_ && kelvin_ == other.kelvin_ &&
                currency_ == other.currency_;
        }